

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapic.cc
# Opt level: O0

bool __thiscall rapic::client::process_traffic(client *this)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  time_t tVar4;
  ulong uVar5;
  void *__buf;
  size_t __n;
  ssize_t sVar6;
  int *piVar7;
  __int_type _Var8;
  __int_type _Var9;
  type __buf_00;
  system_error *this_00;
  runtime_error *this_01;
  char *pcVar10;
  ulong uVar11;
  long in_RDI;
  ssize_t bytes;
  unsigned_long space;
  unsigned_long wpos;
  unsigned_long rpos;
  ssize_t ret;
  time_t now;
  socklen_t len;
  int res;
  size_t in_stack_fffffffffffffee8;
  client *in_stack_fffffffffffffef0;
  __atomic_base<unsigned_long> *in_stack_fffffffffffffef8;
  char *__what;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  int iVar12;
  undefined8 in_stack_ffffffffffffff08;
  system_error *in_stack_ffffffffffffff10;
  system_error *local_d8;
  undefined8 in_stack_ffffffffffffffb0;
  socklen_t local_24;
  int local_20 [8];
  
  if (*(int *)(in_RDI + 0x6c) == 0) {
    return false;
  }
  if (*(int *)(in_RDI + 0x6c) == 1) {
    bVar1 = is_socket_writeable((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    if (!bVar1) {
      return false;
    }
    local_20[0] = 0;
    local_24 = 4;
    iVar2 = getsockopt(*(int *)(in_RDI + 0x68),1,4,local_20,&local_24);
    iVar12 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
    if (iVar2 < 0) {
      uVar3 = __cxa_allocate_exception(0x20);
      __errno_location();
      std::_V2::system_category();
      std::system_error::system_error
                (in_stack_ffffffffffffff10,iVar12,
                 (error_category *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 (char *)in_stack_fffffffffffffef8);
      __cxa_throw(uVar3,&std::system_error::typeinfo,std::system_error::~system_error);
    }
    if (local_20[0] == 0x73) {
      return false;
    }
    if (local_20[0] < 0) {
      uVar3 = __cxa_allocate_exception(0x20);
      std::_V2::system_category();
      std::system_error::system_error
                (in_stack_ffffffffffffff10,iVar12,
                 (error_category *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 (char *)in_stack_fffffffffffffef8);
      __cxa_throw(uVar3,&std::system_error::typeinfo,std::system_error::~system_error);
    }
    *(undefined4 *)(in_RDI + 0x6c) = 2;
  }
  tVar4 = time((time_t *)0x0);
  if (*(long *)(in_RDI + 0x40) < tVar4 - *(long *)(in_RDI + 0x70)) {
    std::__cxx11::string::append((string *)(in_RDI + 0x80));
    *(time_t *)(in_RDI + 0x70) = tVar4;
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    while( true ) {
      iVar2 = *(int *)(in_RDI + 0x68);
      __buf = (void *)std::__cxx11::string::c_str();
      __n = std::__cxx11::string::size();
      sVar6 = write(iVar2,__buf,__n);
      if (((sVar6 != -1) || (piVar7 = __errno_location(), *piVar7 == 0xb)) ||
         (piVar7 = __errno_location(), *piVar7 == 0xb)) break;
      piVar7 = __errno_location();
      iVar2 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
      if (*piVar7 != 4) {
        uVar3 = __cxa_allocate_exception(0x20);
        __errno_location();
        std::_V2::system_category();
        std::system_error::system_error
                  (in_stack_ffffffffffffff10,iVar2,
                   (error_category *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   (char *)in_stack_fffffffffffffef8);
        __cxa_throw(uVar3,&std::system_error::typeinfo,std::system_error::~system_error);
      }
    }
    std::__cxx11::string::erase(in_RDI + 0x80,0);
  }
  while( true ) {
    _Var8 = std::__atomic_base::operator_cast_to_unsigned_long(in_stack_fffffffffffffef8);
    _Var9 = std::__atomic_base::operator_cast_to_unsigned_long(in_stack_fffffffffffffef8);
    if (_Var8 - _Var9 == *(long *)(in_RDI + 0xa8)) {
      return true;
    }
    _Var8 = std::__atomic_base::operator_cast_to_unsigned_long(in_stack_fffffffffffffef8);
    uVar5 = _Var8 % *(ulong *)(in_RDI + 0xa8);
    _Var8 = std::__atomic_base::operator_cast_to_unsigned_long(in_stack_fffffffffffffef8);
    uVar11 = _Var8 % *(ulong *)(in_RDI + 0xa8);
    if (uVar11 < uVar5) {
      local_d8 = (system_error *)(uVar5 - uVar11);
    }
    else {
      local_d8 = (system_error *)(*(long *)(in_RDI + 0xa8) - uVar11);
    }
    iVar2 = *(int *)(in_RDI + 0x68);
    __buf_00 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                          in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    this_00 = (system_error *)recv(iVar2,__buf_00,(size_t)local_d8,0);
    if (0 < (long)this_00) {
      *(time_t *)(in_RDI + 0x78) = tVar4;
      std::__atomic_base<unsigned_long>::operator+=
                ((__atomic_base<unsigned_long> *)(in_RDI + 0xb0),(__int_type)this_00);
      return this_00 == local_d8;
    }
    if (-1 < (long)this_00) {
      disconnect(in_stack_fffffffffffffef0);
      return false;
    }
    piVar7 = __errno_location();
    if ((*piVar7 == 0xb) || (piVar7 = __errno_location(), *piVar7 == 0xb)) break;
    piVar7 = __errno_location();
    iVar2 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
    if (*piVar7 != 4) {
      pcVar10 = (char *)__cxa_allocate_exception(0x20);
      __what = pcVar10;
      piVar7 = __errno_location();
      iVar12 = *piVar7;
      std::_V2::system_category();
      std::system_error::system_error
                (this_00,iVar2,(error_category *)CONCAT44(iVar12,in_stack_ffffffffffffff00),__what);
      __cxa_throw(pcVar10,&std::system_error::typeinfo,std::system_error::~system_error);
    }
  }
  if (tVar4 - *(long *)(in_RDI + 0x78) <= *(long *)(in_RDI + 0x48)) {
    return false;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"rapic: inactivity timeout");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto client::process_traffic() -> bool
try
{
  // sanity check
  if (state_ == rapic::connection_state::disconnected)
    return false;

  // need to check our connection attempt progress
  if (state_ == rapic::connection_state::in_progress)
  {
    /* SO_ERROR is only set once the socket is writeable, so manually check via select that it is.
     * without this check clients can call process_traffic() before the socket is writeable and cause
     * the connection to look established before it really is. */
    if (!is_socket_writeable(socket_))
      return false;

    // get the socket error status
    int res = 0; socklen_t len = sizeof(res);
    if (getsockopt(socket_, SOL_SOCKET, SO_ERROR, &res, &len) < 0)
      throw std::system_error{errno, std::system_category(), "rapic: getsockopt failure"};

    // not connected yet?
    if (res == EINPROGRESS)
      return false;

    // okay, connection attempt is complete.  did it succeed?
    if (res < 0)
      throw std::system_error{res, std::system_category(), "rapic: failed to establish connection (async)"};

    state_ = rapic::connection_state::established;
  }

  // get current time
  auto now = time(NULL);

  // do we need to send a keepalive? (ie: RDRSTAT)
  if (now - last_keepalive_ > keepalive_period_)
  {
    wbuffer_.append(msg_keepalive);
    last_keepalive_ = now;
  }

  // write everything we can
  if (!wbuffer_.empty())
  {
    // write as much as we can
    ssize_t ret;
    while ((ret = write(socket_, wbuffer_.c_str(), wbuffer_.size())) == -1)
    {
      if (errno == EAGAIN || errno == EWOULDBLOCK)
      {
        ret = 0;
        break;
      }
      else if (errno != EINTR)
        throw std::system_error{errno, std::system_category(), "rapic: write failure"};
    }

    // remove the written data from the buffer
    wbuffer_.erase(0, ret);
  }

  // read everything we can
  while (true)
  {
    // if our buffer is full return and allow client to do some reading
    if (wcount_ - rcount_ == capacity_)
      return true;

    // determine current read and write positions
    auto rpos = rcount_ % capacity_;
    auto wpos = wcount_ % capacity_;

    // see how much _contiguous_ space is left in our buffer (may be less than total available write space)
    auto space = wpos < rpos ? rpos - wpos : capacity_ - wpos;

    // read some data off the wire
    auto bytes = recv(socket_, &buffer_[wpos], space, 0);
    if (bytes > 0)
    {
      // reset our inactivity timeout
      last_activity_ = now;

      // advance our write position
      wcount_ += bytes;

      // if we read as much as we asked for there may be more still waiting so return true
      return static_cast<size_t>(bytes) == space;
    }
    else if (bytes < 0)
    {
      // if we've run out of data to read stop trying
      if (errno == EAGAIN || errno == EWOULDBLOCK)
      {
        // check our inactivity timeout
        if (now - last_activity_ > inactivity_timeout_)
          throw std::runtime_error{"rapic: inactivity timeout"};

        return false;
      }

      // if we were interrupted by a signal handler just try again
      if (errno == EINTR)
        continue;

      // a real receive error - kill the connection
      throw std::system_error{errno, std::system_category(), "rapic: recv failure"};
    }
    else /* if (bytes == 0) */
    {
      // connection has been closed normally by the remote side
      disconnect();
      return false;
    }
  }
}
catch (...)
{
  disconnect();
  throw;
}